

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppAutoResize(bool *p_open)

{
  bool bVar1;
  uint local_14;
  int i;
  bool *p_open_local;
  
  bVar1 = ImGui::Begin("Example: Auto-resizing window",p_open,0x40);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0x1c4c,"Examples/Auto-resizing window",GImGuiDemoMarkerCallbackUserData);
    }
    ImGui::TextUnformatted
              ("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
               ,(char *)0x0);
    ImGui::SliderInt("Number of lines",&ShowExampleAppAutoResize::lines,1,0x14,"%d",0);
    for (local_14 = 0; (int)local_14 < ShowExampleAppAutoResize::lines; local_14 = local_14 + 1) {
      ImGui::Text("%*sThis is line %d",(ulong)(local_14 << 2),"",(ulong)local_14);
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppAutoResize(bool* p_open)
{
    if (!ImGui::Begin("Example: Auto-resizing window", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    IMGUI_DEMO_MARKER("Examples/Auto-resizing window");

    static int lines = 10;
    ImGui::TextUnformatted(
        "Window will resize every-frame to the size of its content.\n"
        "Note that you probably don't want to query the window size to\n"
        "output your content because that would create a feedback loop.");
    ImGui::SliderInt("Number of lines", &lines, 1, 20);
    for (int i = 0; i < lines; i++)
        ImGui::Text("%*sThis is line %d", i * 4, "", i); // Pad with space to extend size horizontally
    ImGui::End();
}